

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O2

bool MeCab::Connector::compile(char *ifile,char *ofile)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  pointer psVar8;
  long *plVar9;
  istringstream *piVar10;
  die local_61d;
  unsigned_short rsize;
  unsigned_short lsize;
  scoped_fixed_array<char,_8192> buf;
  vector<short,_std::allocator<short>_> matrix;
  char *column [4];
  ofstream ofs;
  byte abStack_598 [480];
  ifstream ifs;
  byte abStack_398 [488];
  istringstream iss;
  
  std::ifstream::ifstream((istringstream *)&ifs,ifile,_S_in);
  std::__cxx11::string::string((string *)&ofs,"1 1\n0 0 0\n",(allocator *)column);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&ofs,_S_in);
  std::__cxx11::string::~string((string *)&ofs);
  piVar10 = (istringstream *)&ifs;
  if ((abStack_398[*(long *)(_ifs + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,ifile);
    poVar6 = std::operator<<(poVar6," is not found. minimum setting is used.");
    std::endl<char,std::char_traits<char>>(poVar6);
    piVar10 = (istringstream *)&iss;
  }
  buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bb18;
  buf.ptr_ = (char *)operator_new__(0x2000);
  buf.size_ = 0x2000;
  std::istream::getline((char *)piVar10,(long)buf.ptr_);
  sVar7 = tokenize2<char**>(buf.ptr_,"\t ",column,2);
  if (sVar7 != 2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x51);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"tokenize2(buf.get(), \"\\t \", column, 2) == 2");
    poVar6 = std::operator<<(poVar6,"] ");
    poVar6 = std::operator<<(poVar6,"format error: ");
    std::operator<<(poVar6,buf.ptr_);
    die::~die((die *)&ofs);
  }
  uVar1 = atoi(column[0]);
  lsize = (ushort)uVar1;
  uVar2 = atoi(column[1]);
  rsize = (ushort)uVar2;
  std::vector<short,_std::allocator<short>_>::vector
            (&matrix,(ulong)((uVar2 & 0xffff) * (uVar1 & 0xffff)),(allocator_type *)&ofs);
  for (psVar8 = matrix.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar8 != matrix.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
    *psVar8 = 0;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"reading ");
  poVar6 = std::operator<<(poVar6,ifile);
  poVar6 = std::operator<<(poVar6," ... ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ushort)uVar1);
  poVar6 = std::operator<<(poVar6,"x");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ushort)uVar2);
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar1 = uVar1 & 0xffff;
  while( true ) {
    plVar9 = (long *)std::istream::getline((char *)piVar10,(long)buf.ptr_);
    if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) break;
    sVar7 = tokenize2<char**>(buf.ptr_,"\t ",column,3);
    if (sVar7 != 3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5d);
      poVar6 = std::operator<<(poVar6,") [");
      poVar6 = std::operator<<(poVar6,"tokenize2(buf.get(), \"\\t \", column, 3) == 3");
      poVar6 = std::operator<<(poVar6,"] ");
      poVar6 = std::operator<<(poVar6,"format error: ");
      std::operator<<(poVar6,buf.ptr_);
      die::~die((die *)&ofs);
    }
    uVar3 = atoi(column[0]);
    uVar4 = atoi(column[1]);
    iVar5 = atoi(column[2]);
    if (uVar1 <= uVar3 || (uVar2 & 0xffff) <= uVar4) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar6 = std::operator<<(poVar6,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x62);
      poVar6 = std::operator<<(poVar6,") [");
      poVar6 = std::operator<<(poVar6,"l < lsize && r < rsize");
      poVar6 = std::operator<<(poVar6,"] ");
      std::operator<<(poVar6,"index values are out of range");
      die::~die((die *)&ofs);
    }
    progress_bar("emitting matrix      ",(long)(int)uVar3 + 1,(ulong)uVar1);
    matrix.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)(int)uVar4 * (ulong)uVar1 + (long)(int)uVar3] = (short)iVar5;
  }
  std::ofstream::ofstream(&ofs,ofile,_S_out|_S_bin);
  if ((abStack_598[*(long *)(_ofs + -0x18)] & 5) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                            );
    poVar6 = std::operator<<(poVar6,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x68);
    poVar6 = std::operator<<(poVar6,") [");
    poVar6 = std::operator<<(poVar6,"ofs");
    poVar6 = std::operator<<(poVar6,"] ");
    poVar6 = std::operator<<(poVar6,"permission denied: ");
    std::operator<<(poVar6,ofile);
    die::~die(&local_61d);
  }
  std::ostream::write((char *)&ofs,(long)&lsize);
  std::ostream::write((char *)&ofs,(long)&rsize);
  std::ostream::write((char *)&ofs,
                      (long)matrix.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&matrix.super__Vector_base<short,_std::allocator<short>_>);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::ifstream::~ifstream(&ifs);
  return true;
}

Assistant:

bool Connector::compile(const char *ifile, const char *ofile) {
  std::ifstream ifs(WPATH(ifile));
  std::istringstream iss(MATRIX_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << ifile
              << " is not found. minimum setting is used." << std::endl;
    is = &iss;
  }


  char *column[4];
  scoped_fixed_array<char, BUF_SIZE> buf;

  is->getline(buf.get(), buf.size());

  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();

  const unsigned short lsize = std::atoi(column[0]);
  const unsigned short rsize = std::atoi(column[1]);
  std::vector<short> matrix(lsize * rsize);
  std::fill(matrix.begin(), matrix.end(), 0);

  std::cout << "reading " << ifile << " ... "
            << lsize << "x" << rsize << std::endl;

  while (is->getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 3) == 3)
        << "format error: " << buf.get();
    const size_t l = std::atoi(column[0]);
    const size_t r = std::atoi(column[1]);
    const int    c = std::atoi(column[2]);
    CHECK_DIE(l < lsize && r < rsize) << "index values are out of range";
    progress_bar("emitting matrix      ", l + 1, lsize);
    matrix[(l + lsize * r)] = static_cast<short>(c);
  }

  std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << ofile;
  ofs.write(reinterpret_cast<const char*>(&lsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&rsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&matrix[0]),
            lsize * rsize * sizeof(short));
  ofs.close();

  return true;
}